

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::iterate
          (SymmetricOuterEdgeCase *this)

{
  void **ppvVar1;
  TessPrimitiveType TVar2;
  SpacingMode SVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 tfPrimTypeGL;
  TestLog *this_00;
  undefined4 extraout_var;
  char *str;
  const_reference pvVar8;
  const_reference pvVar9;
  RenderContext *renderCtx_00;
  size_type sVar10;
  const_reference this_01;
  MessageBuilder *pMVar11;
  ShaderProgram *this_02;
  TestLog *pTVar12;
  const_reference pvVar13;
  float fVar14;
  VecAccess<float,_3,_2> VVar15;
  VertexArrayBinding *local_1110;
  bool local_1019;
  bool local_100b;
  bool local_1009;
  bool local_ffa;
  string local_ef0;
  string local_ed0;
  MessageBuilder local_eb0;
  MessageBuilder local_d30;
  string local_bb0;
  string local_b90;
  MessageBuilder local_b70;
  MessageBuilder local_9f0;
  VecAccess<float,_3,_2> local_870;
  Vector<bool,_2> local_85a;
  Vector<float,_2> local_858;
  Vector<float,_2> local_850;
  Vector<float,_2> local_848;
  VecAccess<float,_3,_2> local_840;
  Vector<bool,_2> local_82e;
  Vector<float,_2> local_82c;
  Vector<float,_2> local_824;
  Vector<float,_2> local_81c;
  Vector<bool,_3> local_813;
  Vector<float,_3> local_810;
  Vector<float,_3> local_804;
  tcu local_7f8 [8];
  float local_7f0;
  Vector<bool,_3> local_7eb;
  Vector<float,_3> local_7e8;
  Vector<float,_3> local_7dc;
  tcu local_7d0 [12];
  undefined1 local_7c4 [8];
  Vec3 endpointB;
  Vec3 endpointA;
  undefined1 local_780 [7];
  bool isMirrored;
  Vector<float,_3> local_774;
  Vector<float,_3> local_768;
  Vector<float,_3> local_75c;
  Vector<bool,_2> local_74e;
  Vector<float,_2> local_74c;
  Vector<float,_2> local_744;
  Vector<float,_2> local_73c;
  undefined1 local_734 [9];
  Vector<bool,_3> local_72b;
  Vector<float,_3> local_728;
  Vector<float,_3> local_71c;
  Vector<float,_3> local_710;
  undefined1 local_704 [20];
  Vec3 *vtx;
  undefined1 local_6e8 [4];
  int vtxNdx;
  Vec3Set mirroredEdgeVertices;
  Vec3Set nonMirroredEdgeVertices;
  string local_680;
  size_type local_660;
  MessageBuilder local_658;
  MessageBuilder local_4d8;
  int local_354;
  undefined1 local_350 [4];
  int refNumVertices;
  Result tfResult;
  undefined1 local_328 [4];
  deUint32 programGL;
  MessageBuilder local_308;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  undefined1 *local_160;
  undefined1 local_158 [8];
  VertexArrayBinding bindings [1];
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  int outerEdgeLevelCaseNdx;
  OuterEdgeDescription *edgeDesc;
  undefined1 local_d8 [4];
  int outerEdgeIndex;
  TFHandler tfHandler;
  undefined1 local_78 [8];
  vector<float,_std::allocator<float>_> patchTessLevels;
  undefined1 local_58 [4];
  int maxNumVerticesInDrawCall;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  SymmetricOuterEdgeCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar7 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x10,0x10,dVar7);
  edgeDescriptions.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  outerEdgeDescriptions
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              *)local_58,this->m_primitiveType);
  fVar14 = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels((vector<float,_std::allocator<float>_> *)local_78,1,0,fVar14);
  TVar2 = this->m_primitiveType;
  SVar3 = this->m_spacing;
  bVar5 = this->m_usePointMode;
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_78,0);
  pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_78,2);
  patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = referenceVertexCount(TVar2,SVar3,(bool)(bVar5 & 1),pvVar8,pvVar9);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_78);
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<tcu::Vector<float,_4>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_4>_> *)local_d8,renderCtx_00,
             patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  setViewport((Functions *)
              edgeDescriptions.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(RandomViewport *)&gl);
  (**(code **)(edgeDescriptions.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[0xfd].
               constantCoordinateValueChoices + 1))(0x8e72);
  edgeDesc._4_4_ = 0;
  while( true ) {
    sVar10 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                     *)local_58);
    if ((int)sVar10 <= edgeDesc._4_4_) break;
    this_01 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                            *)local_58,(long)edgeDesc._4_4_);
    for (patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 0xc;
        patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      generatePatchTessLevels
                ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data,1,edgeDesc._4_4_
                 ,iterate::singleOuterEdgeLevels
                  [patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_]);
      local_182 = 1;
      local_160 = local_158;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"in_v_attr",&local_181);
      ppvVar1 = &bindings[0].pointer.data;
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)ppvVar1);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,0);
      glu::va::Float((VertexArrayBinding *)local_158,&local_180,1,(int)sVar10,0,pvVar8);
      local_182 = 0;
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      tcu::TestLog::operator<<(&local_308,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_308,(char (*) [39])"Testing with outer tessellation level ");
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,iterate::singleOuterEdgeLevels +
                                   patchTessLevels_1.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])0x2a64a2c);
      Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)local_328,this_01);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_328);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(char (*) [47])" edge, and with various levels for other edges");
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_328);
      tcu::MessageBuilder::~MessageBuilder(&local_308);
      this_02 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
      tfResult.varying.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = glu::ShaderProgram::getProgram(this_02);
      (**(code **)(edgeDescriptions.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x168))
                (tfResult.varying.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar7 = tfResult.varying.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tfPrimTypeGL = outputPrimitiveTypeGL(this->m_primitiveType,(bool)(this->m_usePointMode & 1));
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data);
      TransformFeedbackHandler<tcu::Vector<float,_4>_>::renderAndGetPrimitives
                ((Result *)local_350,(TransformFeedbackHandler<tcu::Vector<float,_4>_> *)local_d8,
                 dVar7,tfPrimTypeGL,1,(VertexArrayBinding *)local_158,(int)sVar10);
      TVar2 = this->m_primitiveType;
      SVar3 = this->m_spacing;
      bVar5 = this->m_usePointMode;
      ppvVar1 = &bindings[0].pointer.data;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,0);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppvVar1,2);
      local_354 = referenceVertexCount(TVar2,SVar3,(bool)(bVar5 & 1),pvVar8,pvVar9);
      sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &tfResult);
      iVar6 = (int)pvVar9;
      if ((int)sVar10 == local_354) {
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
               *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
               *)local_6e8);
        for (vtx._4_4_ = 0; iVar6 = (int)pvVar9, vtx._4_4_ < local_354; vtx._4_4_ = vtx._4_4_ + 1) {
          pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)&tfResult,(long)vtx._4_4_);
          pvVar9 = (const_reference)0x2;
          tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_704,(int)pvVar13,0,1);
          local_704._12_8_ = local_704;
          bVar5 = OuterEdgeDescription::contains(this_01,(Vec3 *)local_704._12_8_);
          uVar4 = local_704._12_8_;
          if (bVar5) {
            local_ffa = false;
            if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              tcu::Vector<float,_3>::Vector(&local_71c,0.0);
              tcu::Vector<float,_3>::Vector(&local_728,0.5);
              singleTrueMask<3>((Functional *)&local_72b,this_01->constantCoordinateIndex);
              tcu::select<float,3>((tcu *)&local_710,&local_71c,&local_728,&local_72b);
              local_ffa = tcu::Vector<float,_3>::operator==((Vector<float,_3> *)uVar4,&local_710);
            }
            if (local_ffa == false) {
              local_1009 = false;
              if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
                tcu::Vector<float,_3>::swizzle
                          ((Vector<float,_3> *)local_734,(int)local_704._12_8_,0);
                tcu::Vector<float,_2>::Vector(&local_744,this_01->constantCoordinateValueChoices[0])
                ;
                tcu::Vector<float,_2>::Vector(&local_74c,0.5);
                singleTrueMask<2>((Functional *)&local_74e,this_01->constantCoordinateIndex);
                tcu::select<float,2>((tcu *)&local_73c,&local_744,&local_74c,&local_74e);
                local_1009 = tcu::Vector<float,_2>::operator==
                                       ((Vector<float,_2> *)local_734,&local_73c);
              }
              uVar4 = local_704._12_8_;
              if (local_1009 == false) {
                local_100b = false;
                if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
                  tcu::Vector<float,_3>::Vector(&local_75c,0.0,0.5,0.0);
                  bVar5 = tcu::Vector<float,_3>::operator==((Vector<float,_3> *)uVar4,&local_75c);
                  uVar4 = local_704._12_8_;
                  local_1019 = true;
                  if (!bVar5) {
                    tcu::Vector<float,_3>::Vector(&local_768,1.0,0.5,0.0);
                    bVar5 = tcu::Vector<float,_3>::operator==((Vector<float,_3> *)uVar4,&local_768);
                    uVar4 = local_704._12_8_;
                    local_1019 = true;
                    if (!bVar5) {
                      tcu::Vector<float,_3>::Vector(&local_774,0.0,0.0,0.0);
                      bVar5 = tcu::Vector<float,_3>::operator==
                                        ((Vector<float,_3> *)uVar4,&local_774);
                      uVar4 = local_704._12_8_;
                      local_1019 = true;
                      if (!bVar5) {
                        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_780,1.0,0.0,0.0);
                        local_1019 = tcu::Vector<float,_3>::operator==
                                               ((Vector<float,_3> *)uVar4,
                                                (Vector<float,_3> *)local_780);
                      }
                    }
                  }
                  local_100b = local_1019;
                }
                if (local_100b == false) {
                  pvVar13 = std::
                            vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                            operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        *)&tfResult,(long)vtx._4_4_);
                  fVar14 = tcu::Vector<float,_4>::w(pvVar13);
                  if (fVar14 <= 0.5) {
                    std::
                    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,(value_type *)local_704._12_8_);
                  }
                  else {
                    std::
                    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_6e8,(value_type *)local_704._12_8_);
                  }
                }
              }
            }
          }
        }
        if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
LAB_02091c45:
          bVar5 = std::operator!=((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,
                                  (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)local_6e8);
          if (bVar5) {
            tcu::TestLog::operator<<(&local_eb0,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_eb0,
                                 (char (*) [121])
                                 "Failure: the set of mirrored edges isn\'t equal to the set of non-mirrored edges (ignoring endpoints and possible middle)"
                                );
            pTVar12 = tcu::MessageBuilder::operator<<
                                (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::TestLog::operator<<(&local_d30,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_d30,(char (*) [30])"Note: non-mirrored vertices:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_ed0,
                       (Functional *)
                       &mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x5,0,iVar6);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ed0);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(char (*) [21])"\nmirrored vertices:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_ef0,(Functional *)local_6e8,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x5,0,iVar6);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ef0);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_ef0);
            std::__cxx11::string::~string((string *)&local_ed0);
            tcu::MessageBuilder::~MessageBuilder(&local_d30);
            tcu::MessageBuilder::~MessageBuilder(&local_eb0);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
            this_local._4_4_ = STOP;
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        }
        else {
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(endpointB.m_data + 1));
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_7c4);
          if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
            tcu::Vector<float,_3>::Vector(&local_7dc,1.0);
            tcu::Vector<float,_3>::Vector(&local_7e8,0.0);
            singleTrueMask<3>((Functional *)&local_7eb,
                              this_01->constantCoordinateIndex + 1 +
                              ((this_01->constantCoordinateIndex + 1) / 3) * -3);
            tcu::select<float,3>(local_7d0,&local_7dc,&local_7e8,&local_7eb);
            endpointB.m_data._4_8_ = local_7d0._0_8_;
            tcu::Vector<float,_3>::Vector(&local_804,1.0);
            tcu::Vector<float,_3>::Vector(&local_810,0.0);
            singleTrueMask<3>((Functional *)&local_813,
                              this_01->constantCoordinateIndex + 2 +
                              ((this_01->constantCoordinateIndex + 2) / 3) * -3);
            tcu::select<float,3>(local_7f8,&local_804,&local_810,&local_813);
            local_7c4[0] = local_7f8[0];
            local_7c4[1] = local_7f8[1];
            local_7c4[2] = local_7f8[2];
            local_7c4[3] = local_7f8[3];
            local_7c4[4] = local_7f8[4];
            local_7c4[5] = local_7f8[5];
            local_7c4[6] = local_7f8[6];
            local_7c4[7] = local_7f8[7];
            endpointB.m_data[0] = local_7f0;
          }
          else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
            tcu::Vector<float,_2>::Vector(&local_824,this_01->constantCoordinateValueChoices[0]);
            tcu::Vector<float,_2>::Vector(&local_82c,0.0);
            singleTrueMask<2>((Functional *)&local_82e,this_01->constantCoordinateIndex);
            tcu::select<float,2>((tcu *)&local_81c,&local_824,&local_82c,&local_82e);
            VVar15 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)(endpointB.m_data + 1));
            local_840 = VVar15;
            tcu::VecAccess<float,_3,_2>::operator=(&local_840,&local_81c);
            tcu::Vector<float,_2>::Vector(&local_850,this_01->constantCoordinateValueChoices[0]);
            tcu::Vector<float,_2>::Vector(&local_858,1.0);
            singleTrueMask<2>((Functional *)&local_85a,this_01->constantCoordinateIndex);
            tcu::select<float,2>((tcu *)&local_848,&local_850,&local_858,&local_85a);
            VVar15 = tcu::Vector<float,_3>::xy((Vector<float,_3> *)local_7c4);
            local_870 = VVar15;
            tcu::VecAccess<float,_3,_2>::operator=(&local_870,&local_848);
          }
          bVar5 = contains<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
                            ((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,(Vector<float,_3> *)(endpointB.m_data + 1));
          if (bVar5) {
            bVar5 = contains<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
                              ((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(Vector<float,_3> *)local_7c4);
            if (bVar5) {
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)(endpointB.m_data + 1));
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)local_7c4);
              goto LAB_02091c45;
            }
          }
          tcu::TestLog::operator<<(&local_b70,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_b70,
                               (char (*) [47])"Failure: edge doesn\'t contain both endpoints, ");
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(Vector<float,_3> *)(endpointB.m_data + 1));
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [6])0x2b82e30);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(Vector<float,_3> *)local_7c4);
          pTVar12 = tcu::MessageBuilder::operator<<
                              (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_9f0,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_9f0,(char (*) [30])"Note: non-mirrored vertices:\n");
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_b90,
                     (Functional *)
                     &mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,iVar6);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_b90);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [21])"\nmirrored vertices:\n")
          ;
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_bb0,(Functional *)local_6e8,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,iVar6);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_bb0);
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_b90);
          tcu::MessageBuilder::~MessageBuilder(&local_9f0);
          tcu::MessageBuilder::~MessageBuilder(&local_b70);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
          this_local._4_4_ = STOP;
          bVar5 = true;
        }
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_6e8);
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)&mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (!bVar5) {
          bVar5 = false;
        }
      }
      else {
        tcu::TestLog::operator<<(&local_658,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_658,
                             (char (*) [67])
                             "Failure: the number of vertices returned by transform feedback is ");
        local_660 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    size((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &tfResult);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_660);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])0x2c24a65);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_354);
        pTVar12 = tcu::MessageBuilder::operator<<
                            (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_4d8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_4d8,
                             (char (*) [110])
                             "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                            );
        containerStr<std::vector<float,std::allocator<float>>>
                  (&local_680,(Functional *)&bindings[0].pointer.data,
                   (vector<float,_std::allocator<float>_> *)0x6,0,iVar6);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_680);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_680);
        tcu::MessageBuilder::~MessageBuilder(&local_4d8);
        tcu::MessageBuilder::~MessageBuilder(&local_658);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid set of vertices");
        this_local._4_4_ = STOP;
        bVar5 = true;
      }
      TransformFeedbackHandler<tcu::Vector<float,_4>_>::Result::~Result((Result *)local_350);
      if (!bVar5) {
        bVar5 = false;
      }
      local_1110 = (VertexArrayBinding *)&bindings[0].pointer.data;
      do {
        local_1110 = local_1110 + -1;
        glu::VertexArrayBinding::~VertexArrayBinding(local_1110);
      } while (local_1110 != (VertexArrayBinding *)local_158);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&bindings[0].pointer.data);
      if (bVar5) goto LAB_02091fd9;
    }
    edgeDesc._4_4_ = edgeDesc._4_4_ + 1;
  }
  bVar5 = false;
LAB_02091fd9:
  TransformFeedbackHandler<tcu::Vector<float,_4>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_4>_> *)local_d8);
  if (!bVar5) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

SymmetricOuterEdgeCase::IterateResult SymmetricOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec4> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const deUint32 programGL = m_program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices.

							{
								Vec3Set nonMirroredEdgeVertices;
								Vec3Set mirroredEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx].swizzle(0,1,2);
									if (edgeDesc.contains(vtx))
									{
										// Ignore the middle vertex of the outer edge, as it's exactly at the mirroring point;
										// for isolines, also ignore (0, 0) and (1, 0) because there's no mirrored counterpart for them.
										if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES && vtx == tcu::select(Vec3(0.0f), Vec3(0.5f), singleTrueMask<3>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_QUADS && vtx.swizzle(0,1) == tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]),
																															   Vec2(0.5f),
																															   singleTrueMask<2>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES && (vtx == Vec3(0.0f, 0.5f, 0.0f) || vtx == Vec3(1.0f, 0.5f, 0.0f) ||
																							  vtx == Vec3(0.0f, 0.0f, 0.0f) || vtx == Vec3(1.0f, 0.0f, 0.0f)))
											continue;

										const bool isMirrored = tfResult.varying[vtxNdx].w() > 0.5f;
										if (isMirrored)
											mirroredEdgeVertices.insert(vtx);
										else
											nonMirroredEdgeVertices.insert(vtx);
									}
								}

								if (m_primitiveType != TESSPRIMITIVETYPE_ISOLINES)
								{
									// Check that both endpoints are present. Note that endpoints aren't mirrored by the shader, since they belong to more than one edge.

									Vec3 endpointA;
									Vec3 endpointB;

									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										endpointA = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 1) % 3));
										endpointB = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 2) % 3));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										endpointA.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(0.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
										endpointB.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(1.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
									}
									else
										DE_ASSERT(false);

									if (!contains(nonMirroredEdgeVertices, endpointA) ||
										!contains(nonMirroredEdgeVertices, endpointB))
									{
										log << TestLog::Message << "Failure: edge doesn't contain both endpoints, " << endpointA << " and " << endpointB << TestLog::EndMessage
											<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
									nonMirroredEdgeVertices.erase(endpointA);
									nonMirroredEdgeVertices.erase(endpointB);
								}

								if (nonMirroredEdgeVertices != mirroredEdgeVertices)
								{
									log << TestLog::Message << "Failure: the set of mirrored edges isn't equal to the set of non-mirrored edges (ignoring endpoints and possible middle)" << TestLog::EndMessage
										<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}